

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_typeSlotAtPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t tuple;
  _Bool _Var1;
  size_t slotIndex;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  _Var1 = sysbvm_tuple_isNonNullPointer(arguments[1]);
  if (!_Var1) {
    sysbvm_error_nullArgument();
  }
  tuple = *arguments;
  slotIndex = sysbvm_typeSlot_getIndex(arguments[1]);
  sysbvm_tuple_slotAtPut(context,tuple,slotIndex,arguments[2]);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_typeSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[1])) sysbvm_error_nullArgument();

    sysbvm_tuple_slotAtPut(context, arguments[0], sysbvm_typeSlot_getIndex(arguments[1]), arguments[2]);
    return SYSBVM_VOID_TUPLE;
}